

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this,
          initializer_list<pstore::command_line::literal> init)

{
  initializer_list<pstore::command_line::literal> __ils;
  initializer_list<pstore::command_line::literal> __ils_00;
  size_type new_cap;
  literal *__first;
  literal *__last;
  back_insert_iterator<pstore::small_vector<pstore::command_line::literal,_3UL>_> __result;
  small_vector<pstore::command_line::literal,_3UL> *this_local;
  initializer_list<pstore::command_line::literal> init_local;
  
  init_local._M_array = (iterator)init._M_len;
  this_local = (small_vector<pstore::command_line::literal,_3UL> *)init._M_array;
  small_vector(this);
  new_cap = std::initializer_list<pstore::command_line::literal>::size
                      ((initializer_list<pstore::command_line::literal> *)&this_local);
  reserve(this,new_cap);
  __ils_00._M_len = (size_type)init_local._M_array;
  __ils_00._M_array = (iterator)this_local;
  __first = std::begin<pstore::command_line::literal>(__ils_00);
  __ils._M_len = (size_type)init_local._M_array;
  __ils._M_array = (iterator)this_local;
  __last = std::end<pstore::command_line::literal>(__ils);
  __result = std::back_inserter<pstore::small_vector<pstore::command_line::literal,3ul>>(this);
  std::
  copy<pstore::command_line::literal_const*,std::back_insert_iterator<pstore::small_vector<pstore::command_line::literal,3ul>>>
            (__first,__last,__result);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }